

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData *
cfd::core::CryptoUtil::ConvertSignatureFromDer
          (ByteData *__return_storage_ptr__,ByteData *der_data,SigHashType *sighash_type)

{
  uint8_t flag;
  CfdException *pCVar1;
  ulong uVar2;
  allocator local_75;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  undefined1 local_58 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> der_sig;
  
  ByteData::GetBytes(&der_sig,der_data);
  uVar2 = (long)der_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)der_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar2 == 0) {
    local_58._0_8_ = "cfdcore_util.cpp";
    local_58._8_4_ = 0x349;
    local_58._16_8_ = "ConvertSignatureFromDer";
    logger::warn<>((CfdSourceLocation *)local_58,"Empty signature.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_58,"der decode error.",(allocator *)&output);
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_58);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (uVar2 < 0x4a) {
    flag = der_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2 - 1];
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&der_sig,uVar2 - 1);
    if (sighash_type != (SigHashType *)0x0) {
      SigHashType::SetFromSigHashFlag(sighash_type,flag);
    }
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&output,0x40,(allocator_type *)local_58);
  ret = wally_ec_sig_from_der
                  (der_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start,
                   (long)der_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)der_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData::ByteData(__return_storage_ptr__,&output);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&der_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_58._0_8_ = "cfdcore_util.cpp";
  local_58._8_4_ = 0x35a;
  local_58._16_8_ = "ConvertSignatureFromDer";
  logger::warn<int&>((CfdSourceLocation *)local_58,"wally_ec_sig_from_der NG[{}].",&ret);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_58,"der decode error.",&local_75);
  CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_58);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::ConvertSignatureFromDer(
    const ByteData &der_data, SigHashType *sighash_type) {
  std::vector<uint8_t> der_sig = der_data.GetBytes();

  if (der_sig.size() == 0) {
    warn(CFD_LOG_SOURCE, "Empty signature.");
    throw CfdException(kCfdIllegalStateError, "der decode error.");
  }

  if (der_sig.size() <= (EC_SIGNATURE_DER_MAX_LEN + 1)) {
    uint8_t sighash_byte = der_sig[der_sig.size() - 1];
    der_sig.resize(der_sig.size() - 1);

    if (sighash_type != nullptr) {
      sighash_type->SetFromSigHashFlag(sighash_byte);
    }
  }

  std::vector<uint8_t> output(EC_SIGNATURE_LEN);
  int ret = wally_ec_sig_from_der(
      der_sig.data(), der_sig.size(), output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_sig_from_der NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "der decode error.");
  }
  return ByteData(output);
}